

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O0

void tommy_trie_insert(tommy_trie *trie,tommy_trie_node *node,void *data,tommy_key_t key)

{
  long lVar1;
  long in_FS_OFFSET;
  tommy_trie_node **let_ptr;
  tommy_key_t key_local;
  void *data_local;
  tommy_trie_node *node_local;
  tommy_trie *trie_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node->data = data;
  node->key = key;
  trie_bucket_insert(trie,0x1b,
                     (tommy_trie_node **)((long)trie->bucket + (ulong)(key >> 0x18 & 0xf8)),node,key
                    );
  trie->count = trie->count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_trie_insert(tommy_trie* trie, tommy_trie_node* node, void* data, tommy_key_t key)
{
	tommy_trie_node** let_ptr;

	node->data = data;
	node->key = key;

	let_ptr = &trie->bucket[key >> TOMMY_TRIE_BUCKET_SHIFT];

	trie_bucket_insert(trie, TOMMY_TRIE_BUCKET_SHIFT, let_ptr, node, key);

	++trie->count;
}